

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssp_blas2.c
# Opt level: O3

int sp_sgemv(char *trans,float alpha,SuperMatrix *A,float *x,int incx,float beta,float *y,int incy)

{
  char cVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  int *piVar5;
  uint uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  undefined8 uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  float fVar21;
  int iVar23;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  int iVar26;
  undefined1 auVar25 [16];
  char msg [256];
  int local_138 [66];
  
  auVar10 = _DAT_001123b0;
  auVar9 = _DAT_001123a0;
  auVar8 = _DAT_00112390;
  cVar1 = *trans;
  pvVar3 = A->Store;
  lVar4 = *(long *)((long)pvVar3 + 8);
  bVar7 = true;
  if (cVar1 != 'N') {
    if ((cVar1 == 'C') || (cVar1 == 'T')) {
      bVar7 = false;
    }
    else if (cVar1 != 'n') {
      local_138[0] = 1;
      goto LAB_00110b8f;
    }
  }
  uVar2 = A->nrow;
  if (-1 < (int)uVar2) {
    uVar15 = A->ncol;
    lVar19 = (long)(int)uVar15;
    if (-1 < lVar19) {
      if (incx == 0) {
        local_138[0] = 5;
      }
      else {
        if (incy != 0) {
          if (uVar15 == 0 || uVar2 == 0) {
            return 0;
          }
          if ((((alpha == 0.0) && (!NAN(alpha))) && (beta == 1.0)) && (!NAN(beta))) {
            return 0;
          }
          uVar6 = uVar2;
          if (cVar1 == 'N') {
            uVar6 = uVar15;
            uVar15 = uVar2;
          }
          uVar20 = (ulong)((1 - uVar6) * incx);
          if (0 < incx) {
            uVar20 = 0;
          }
          iVar17 = (1 - uVar15) * incy;
          if (0 < incy) {
            iVar17 = 0;
          }
          if ((beta != 1.0) || (NAN(beta))) {
            if (incy == 1) {
              if ((beta != 0.0) || (NAN(beta))) {
                uVar11 = 0;
                do {
                  y[uVar11] = y[uVar11] * beta;
                  uVar11 = uVar11 + 1;
                } while (uVar15 != uVar11);
              }
              else {
                memset(y,0,(ulong)uVar15 << 2);
              }
            }
            else {
              lVar13 = (long)incy;
              if ((beta != 0.0) || (NAN(beta))) {
                pfVar12 = y + iVar17;
                do {
                  *pfVar12 = *pfVar12 * beta;
                  pfVar12 = pfVar12 + lVar13;
                  uVar15 = uVar15 - 1;
                } while (uVar15 != 0);
              }
              else {
                uVar15 = uVar15 - 1;
                auVar22._4_4_ = 0;
                auVar22._0_4_ = uVar15;
                auVar22._8_4_ = uVar15;
                auVar22._12_4_ = 0;
                pfVar12 = y + iVar17;
                uVar11 = 0;
                auVar22 = auVar22 ^ _DAT_001123b0;
                do {
                  auVar24._8_4_ = (int)uVar11;
                  auVar24._0_8_ = uVar11;
                  auVar24._12_4_ = (int)(uVar11 >> 0x20);
                  auVar25 = (auVar24 | auVar9) ^ auVar10;
                  iVar23 = auVar22._4_4_;
                  if ((bool)(~(auVar25._4_4_ == iVar23 && auVar22._0_4_ < auVar25._0_4_ ||
                              iVar23 < auVar25._4_4_) & 1)) {
                    *pfVar12 = 0.0;
                  }
                  if ((auVar25._12_4_ != auVar22._12_4_ || auVar25._8_4_ <= auVar22._8_4_) &&
                      auVar25._12_4_ <= auVar22._12_4_) {
                    pfVar12[lVar13] = 0.0;
                  }
                  auVar24 = (auVar24 | auVar8) ^ auVar10;
                  iVar26 = auVar24._4_4_;
                  if (iVar26 <= iVar23 && (iVar26 != iVar23 || auVar24._0_4_ <= auVar22._0_4_)) {
                    pfVar12[lVar13 * 2] = 0.0;
                    pfVar12[lVar13 * 3] = 0.0;
                  }
                  uVar11 = uVar11 + 4;
                  pfVar12 = pfVar12 + lVar13 * 4;
                } while (((ulong)uVar15 + 4 & 0xfffffffffffffffc) != uVar11);
              }
            }
          }
          if ((alpha == 0.0) && (!NAN(alpha))) {
            return 0;
          }
          if (bVar7) {
            if (incy == 1) {
              lVar13 = 0;
              do {
                fVar21 = x[uVar20];
                if ((fVar21 != 0.0) || (NAN(fVar21))) {
                  iVar17 = *(int *)(*(long *)((long)pvVar3 + 0x18) + lVar13 * 4);
                  lVar16 = (long)iVar17;
                  iVar23 = *(int *)(*(long *)((long)pvVar3 + 0x18) + 4 + lVar13 * 4);
                  if (iVar17 < iVar23) {
                    lVar18 = *(long *)((long)pvVar3 + 0x10);
                    do {
                      iVar17 = *(int *)(lVar18 + lVar16 * 4);
                      y[iVar17] = *(float *)(lVar4 + lVar16 * 4) * fVar21 * alpha + y[iVar17];
                      lVar16 = lVar16 + 1;
                    } while (iVar23 != lVar16);
                  }
                }
                uVar20 = uVar20 + (long)incx;
                lVar13 = lVar13 + 1;
              } while (lVar13 != lVar19);
              return 0;
            }
            uVar14 = 0x1ce;
          }
          else {
            if (incx == 1) {
              piVar5 = *(int **)((long)pvVar3 + 0x18);
              lVar13 = (long)iVar17;
              lVar16 = 0;
              iVar17 = *piVar5;
              do {
                iVar23 = piVar5[lVar16 + 1];
                fVar21 = 0.0;
                if (iVar17 < iVar23) {
                  lVar18 = (long)iVar17;
                  do {
                    fVar21 = fVar21 + *(float *)(lVar4 + lVar18 * 4) *
                                      x[*(int *)(*(long *)((long)pvVar3 + 0x10) + lVar18 * 4)];
                    lVar18 = lVar18 + 1;
                  } while (iVar23 != lVar18);
                }
                lVar16 = lVar16 + 1;
                y[lVar13] = fVar21 * alpha + y[lVar13];
                lVar13 = lVar13 + incy;
                iVar17 = iVar23;
              } while (lVar16 != lVar19);
              return 0;
            }
            uVar14 = 0x1de;
          }
          sprintf((char *)local_138,"%s at line %d in file %s\n","Not implemented.",uVar14,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/ssp_blas2.c"
                 );
          superlu_abort_and_exit((char *)local_138);
          return 0;
        }
        local_138[0] = 8;
      }
      goto LAB_00110b8f;
    }
  }
  local_138[0] = 3;
LAB_00110b8f:
  input_error("sp_sgemv ",local_138);
  return 0;
}

Assistant:

int
sp_sgemv(char *trans, float alpha, SuperMatrix *A, float *x, 
	 int incx, float beta, float *y, int incy)
{
    /* Local variables */
    NCformat *Astore;
    float   *Aval;
    int info;
    float temp;
    int lenx, leny;
    int iy, jx, jy, kx, ky, irow;
    int_t i, j;
    int notran;

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0 )
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_sgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if (A->nrow == 0 || A->ncol == 0 || (alpha == 0. && beta == 1.))
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if (strncmp(trans, "N", 1)==0) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if (beta != 1.) {
	if (incy == 1) {
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) y[i] = 0.;
	    else
		for (i = 0; i < leny; ++i) y[i] = beta * y[i];
	} else {
	    iy = ky;
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) {
		    y[iy] = 0.;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    y[iy] = beta * y[iy];
		    iy += incy;
		}
	}
    }
    
    if (alpha == 0.) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if (x[jx] != 0.) {
		    temp = alpha * x[jx];
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			y[irow] += temp * Aval[i];
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = 0.;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp += Aval[i] * x[irow];
		}
		y[jy] += alpha * temp;
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;
}